

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  ImVec4 *pIVar1;
  int iVar2;
  ImDrawChannel *pIVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  ImVector<ImDrawCmd> *this_00;
  long lVar9;
  ImDrawCmd draw_cmd;
  
  iVar2 = (this->_Channels).Size;
  if (iVar2 < channels_count) {
    ImVector<ImDrawChannel>::resize(&this->_Channels,channels_count);
  }
  this->_ChannelsCount = channels_count;
  pIVar3 = (this->_Channels).Data;
  (pIVar3->IdxBuffer).Size = 0;
  (pIVar3->IdxBuffer).Capacity = 0;
  (pIVar3->IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar3->CmdBuffer).Size = 0;
  (pIVar3->CmdBuffer).Capacity = 0;
  (pIVar3->CmdBuffer).Data = (ImDrawCmd *)0x0;
  lVar9 = 0x20;
  for (lVar8 = 1; lVar8 < channels_count; lVar8 = lVar8 + 1) {
    this_00 = (ImVector<ImDrawCmd> *)((long)&(((this->_Channels).Data)->CmdBuffer).Size + lVar9);
    if (lVar8 < iVar2) {
      ImVector<ImDrawCmd>::resize(this_00,0);
      ImVector<unsigned_short>::resize
                ((ImVector<unsigned_short> *)
                 ((long)&(((this->_Channels).Data)->IdxBuffer).Size + lVar9),0);
    }
    else {
      this_00[1].Size = 0;
      this_00[1].Capacity = 0;
      this_00[1].Data = (ImDrawCmd *)0x0;
      this_00->Size = 0;
      this_00->Capacity = 0;
      this_00->Data = (ImDrawCmd *)0x0;
    }
    pIVar3 = (this->_Channels).Data;
    if (*(int *)((long)&(pIVar3->CmdBuffer).Size + lVar9) == 0) {
      draw_cmd.ElemCount = 0;
      draw_cmd.UserCallback = (ImDrawCallback)0x0;
      draw_cmd.UserCallbackData = (void *)0x0;
      pIVar1 = (this->_ClipRectStack).Data + (long)(this->_ClipRectStack).Size + -1;
      uVar4 = pIVar1->x;
      uVar5 = pIVar1->y;
      uVar6 = pIVar1->z;
      uVar7 = pIVar1->w;
      draw_cmd.TextureId = (this->_TextureIdStack).Data[(long)(this->_TextureIdStack).Size + -1];
      draw_cmd.ClipRect.x = (float)uVar4;
      draw_cmd.ClipRect.y = (float)uVar5;
      draw_cmd.ClipRect.z = (float)uVar6;
      draw_cmd.ClipRect.w = (float)uVar7;
      ImVector<ImDrawCmd>::push_back
                ((ImVector<ImDrawCmd> *)((long)&(pIVar3->CmdBuffer).Size + lVar9),&draw_cmd);
    }
    lVar9 = lVar9 + 0x20;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24/32 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}